

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  int iVar1;
  int_type iVar2;
  int *piVar3;
  char *pcVar4;
  ulonglong uVar5;
  longlong lVar6;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  long in_RDI;
  longlong x_1;
  unsigned_long_long x;
  char *endptr;
  token_type number_type;
  int in_stack_ffffffffffffff9c;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_ffffffffffffffa0;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_ffffffffffffffb0;
  char *local_20;
  int local_14;
  
  reset(in_stack_ffffffffffffffb0);
  local_14 = 5;
  iVar1 = *(int *)(in_RDI + 0x10);
  if (iVar1 == 0x2d) {
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
LAB_001b4410:
    local_14 = 6;
    iVar2 = get(in_stack_ffffffffffffffb0);
    if (iVar2 != 0x30) {
      if (8 < iVar2 - 0x31U) {
        *(char **)(in_RDI + 0x68) = "invalid number; expected digit after \'-\'";
        return parse_error;
      }
      add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
LAB_001b44cf:
      do {
        iVar2 = get(in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffb0 =
             (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)(ulong)(iVar2 - 0x2e);
        switch(in_stack_ffffffffffffffb0) {
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x0:
          goto switchD_001b44fb_caseD_0;
        default:
          goto LAB_001b46ab;
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x2:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x3:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x4:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x5:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x6:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x7:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x8:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x9:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0xa:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0xb:
          add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          break;
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x17:
        case (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)0x37:
          add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          goto LAB_001b45d3;
        }
      } while( true );
    }
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else {
    if (iVar1 != 0x30) {
      if (iVar1 - 0x31U < 9) {
        add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        goto LAB_001b44cf;
      }
      goto LAB_001b4410;
    }
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  iVar2 = get(in_stack_ffffffffffffffb0);
  if (iVar2 == 0x2e) {
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    goto LAB_001b4536;
  }
  if ((iVar2 != 0x45) && (iVar2 != 0x65)) goto LAB_001b46ab;
  add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  goto LAB_001b45d3;
switchD_001b44fb_caseD_0:
  add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
LAB_001b4536:
  local_14 = 7;
  iVar2 = get(in_stack_ffffffffffffffb0);
  if (9 < iVar2 - 0x30U) {
    *(char **)(in_RDI + 0x68) = "invalid number; expected digit after \'.\'";
    return parse_error;
  }
  add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  while (iVar2 = get(in_stack_ffffffffffffffb0), iVar2 - 0x30U < 10) {
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  if ((iVar2 != 0x45) && (iVar2 != 0x65)) goto LAB_001b46ab;
  add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
LAB_001b45d3:
  local_14 = 7;
  iVar2 = get(in_stack_ffffffffffffffb0);
  if ((iVar2 == 0x2b) || (iVar2 == 0x2d)) {
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    iVar2 = get(in_stack_ffffffffffffffb0);
    if (9 < iVar2 - 0x30U) {
      *(char **)(in_RDI + 0x68) = "invalid number; expected digit after exponent sign";
      return parse_error;
    }
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else {
    if (9 < iVar2 - 0x30U) {
      *(char **)(in_RDI + 0x68) = "invalid number; expected \'+\', \'-\', or digit after exponent";
      return parse_error;
    }
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  while (iVar2 = get(in_stack_ffffffffffffffb0), iVar2 - 0x30U < 10) {
    add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
LAB_001b46ab:
  unget(in_stack_ffffffffffffffa0);
  local_20 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (local_14 == 5) {
    pcVar4 = (char *)std::__cxx11::string::data();
    uVar5 = strtoull(pcVar4,&local_20,10);
    piVar3 = __errno_location();
    if ((*piVar3 == 0) &&
       (*(ulonglong *)(in_RDI + 0x78) = uVar5, *(ulonglong *)(in_RDI + 0x78) == uVar5)) {
      return value_unsigned;
    }
  }
  else if (local_14 == 6) {
    pcVar4 = (char *)std::__cxx11::string::data();
    lVar6 = strtoll(pcVar4,&local_20,10);
    piVar3 = __errno_location();
    if ((*piVar3 == 0) && (*(longlong *)(in_RDI + 0x70) = lVar6, *(long *)(in_RDI + 0x70) == lVar6))
    {
      return value_integer;
    }
  }
  this_00 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)(in_RDI + 0x80);
  pcVar4 = (char *)std::__cxx11::string::data();
  strtof(this_00,pcVar4,&local_20);
  return value_float;
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                assert(false);  // LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr;
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        assert(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }